

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>::Maybe
          (Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *this,
          Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *other)

{
  kj::_::NullableValue<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>::NullableValue
            (&this->ptr,&other->ptr);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }